

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EPoller.cpp
# Opt level: O0

void __thiscall EPoller::fillActiveChannels(EPoller *this,int numEvents,ChannelList *activeChannels)

{
  bool bVar1;
  const_reference pvVar2;
  pointer pvVar3;
  element_type *this_00;
  undefined1 local_48 [8];
  shared_ptr<Channel> channel;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false> local_30;
  const_iterator it;
  int fd;
  int i;
  ChannelList *activeChannels_local;
  int numEvents_local;
  EPoller *this_local;
  
  it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>._M_cur._4_4_
       = 0;
  while( true ) {
    if (numEvents <=
        it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>._M_cur.
        _4_4_) {
      return;
    }
    pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                       (&this->events_,
                        (long)it.
                              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>
                              ._M_cur._4_4_);
    it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>._M_cur.
    _0_4_ = (pvVar2->data).fd;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>_>
         ::find(&this->channels_,(key_type *)&it);
    channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         unordered_map<int,_std::shared_ptr<Channel>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Channel>_>_>_>
         ::end(&this->channels_);
    bVar1 = std::__detail::operator!=
                      (&local_30,
                       (_Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>
                        *)&channel.super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (!bVar1) break;
    pvVar3 = std::__detail::
             _Node_const_iterator<std::pair<const_int,_std::shared_ptr<Channel>_>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_int,_std::shared_ptr<Channel>_>,_false,_false>
                         *)&local_30);
    std::shared_ptr<Channel>::shared_ptr((shared_ptr<Channel> *)local_48,&pvVar3->second);
    this_00 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         local_48);
    pvVar2 = std::vector<epoll_event,_std::allocator<epoll_event>_>::operator[]
                       (&this->events_,
                        (long)it.
                              super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>
                              ._M_cur._4_4_);
    Channel::setRevents(this_00,pvVar2->events);
    std::vector<std::shared_ptr<Channel>,_std::allocator<std::shared_ptr<Channel>_>_>::push_back
              (activeChannels,(value_type *)local_48);
    std::shared_ptr<Channel>::~shared_ptr((shared_ptr<Channel> *)local_48);
    it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>._M_cur.
    _4_4_ = it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Channel>_>,_false>.
            _M_cur._4_4_ + 1;
  }
  __assert_fail("it != channels_.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/EPoller.cpp"
                ,0x27,"void EPoller::fillActiveChannels(int, ChannelList *) const");
}

Assistant:

void EPoller::fillActiveChannels(int numEvents, ChannelList* activeChannels) const {
    for(int i = 0; i < numEvents; ++i) {
        int fd = events_[i].data.fd;
        auto it = channels_.find(fd);
        assert(it != channels_.end());
        auto channel = it->second;
        channel->setRevents(events_[i].events);
        activeChannels->push_back(channel);
    } 
}